

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int string_cmp_chars(http_string_t string,char *chars)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_21;
  char *chars_local;
  http_string_t string_local;
  
  sVar2 = strlen(chars);
  local_21 = false;
  if (sVar2 == string.len) {
    iVar1 = nh_string_cmp(string.value,chars,(int)string.len);
    local_21 = iVar1 != 0;
  }
  return (int)local_21;
}

Assistant:

int string_cmp_chars(http_string_t string, char const chars[static 1]) {
    return strlen(chars) == string.len && nh_string_cmp(string.value, chars, string.len);
}